

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_encoding
pugi::impl::anon_unknown_0::get_buffer_encoding(xml_encoding encoding,void *contents,size_t size)

{
  bool bVar1;
  size_t in_RSI;
  xml_encoding in_EDI;
  uint8_t *data;
  uint in_stack_fffffffffffffffc;
  
  if (in_EDI == encoding_wchar) {
    in_EDI = get_wchar_encoding();
  }
  else if (in_EDI == encoding_utf16) {
    bVar1 = is_little_endian();
    in_EDI = encoding_utf16_be;
    if (bVar1) {
      in_EDI = encoding_utf16_le;
    }
  }
  else if (in_EDI == encoding_utf32) {
    bVar1 = is_little_endian();
    in_EDI = encoding_utf32_be;
    if (bVar1) {
      in_EDI = encoding_utf32_le;
    }
  }
  else if (in_EDI == encoding_auto) {
    in_EDI = guess_buffer_encoding((uint8_t *)((ulong)in_stack_fffffffffffffffc << 0x20),in_RSI);
  }
  return in_EDI;
}

Assistant:

PUGI_IMPL_FN xml_encoding get_buffer_encoding(xml_encoding encoding, const void* contents, size_t size)
	{
		// replace wchar encoding with utf implementation
		if (encoding == encoding_wchar) return get_wchar_encoding();

		// replace utf16 encoding with utf16 with specific endianness
		if (encoding == encoding_utf16) return is_little_endian() ? encoding_utf16_le : encoding_utf16_be;

		// replace utf32 encoding with utf32 with specific endianness
		if (encoding == encoding_utf32) return is_little_endian() ? encoding_utf32_le : encoding_utf32_be;

		// only do autodetection if no explicit encoding is requested
		if (encoding != encoding_auto) return encoding;

		// try to guess encoding (based on XML specification, Appendix F.1)
		const uint8_t* data = static_cast<const uint8_t*>(contents);

		return guess_buffer_encoding(data, size);
	}